

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight::
BayesianProbitRegressor_FeatureValueWeight
          (BayesianProbitRegressor_FeatureValueWeight *this,
          BayesianProbitRegressor_FeatureValueWeight *from)

{
  bool bVar1;
  BayesianProbitRegressor_Gaussian *this_00;
  BayesianProbitRegressor_FeatureValueWeight *from_local;
  BayesianProbitRegressor_FeatureValueWeight *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__BayesianProbitRegressor_FeatureValueWeight_006fb8e8;
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  bVar1 = _internal_has_featureweight(from);
  if (bVar1) {
    this_00 = (BayesianProbitRegressor_Gaussian *)operator_new(0x28);
    BayesianProbitRegressor_Gaussian::BayesianProbitRegressor_Gaussian(this_00,from->featureweight_)
    ;
    this->featureweight_ = this_00;
  }
  else {
    this->featureweight_ = (BayesianProbitRegressor_Gaussian *)0x0;
  }
  this->featurevalue_ = from->featurevalue_;
  return;
}

Assistant:

BayesianProbitRegressor_FeatureValueWeight::BayesianProbitRegressor_FeatureValueWeight(const BayesianProbitRegressor_FeatureValueWeight& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  if (from._internal_has_featureweight()) {
    featureweight_ = new ::CoreML::Specification::BayesianProbitRegressor_Gaussian(*from.featureweight_);
  } else {
    featureweight_ = nullptr;
  }
  featurevalue_ = from.featurevalue_;
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.BayesianProbitRegressor.FeatureValueWeight)
}